

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fp-impl.inc.c
# Opt level: O2

void gen_stfqu(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx;
  uint uVar1;
  TCGv_i64 dst;
  TCGv_i64 EA;
  TCGv_i64 ret;
  uint uVar2;
  uintptr_t o;
  uintptr_t o_2;
  uintptr_t o_1;
  
  tcg_ctx = ctx->uc->tcg_ctx;
  uVar1 = ctx->opcode >> 0x10 & 0x1f;
  uVar2 = ctx->opcode >> 0x15;
  gen_set_access_type(ctx,0x30);
  dst = tcg_temp_new_i64(tcg_ctx);
  EA = tcg_temp_new_i64(tcg_ctx);
  gen_addr_imm_index(ctx,EA,0);
  get_fpr(tcg_ctx,dst,uVar2 & 0x1f);
  gen_qemu_st64_i64(ctx,dst,EA);
  ret = tcg_temp_new_i64(tcg_ctx);
  gen_addr_add(ctx,ret,EA,8);
  get_fpr(tcg_ctx,dst,uVar2 + 1 & 0x1f);
  gen_qemu_st64_i64(ctx,dst,ret);
  tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(ret + (long)tcg_ctx));
  if (uVar1 != 0) {
    tcg_gen_mov_i64_ppc64(tcg_ctx,cpu_gpr[uVar1],EA);
  }
  tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(EA + (long)tcg_ctx));
  tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(dst + (long)tcg_ctx));
  return;
}

Assistant:

static void gen_stfqu(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    int ra = rA(ctx->opcode);
    int rd = rD(ctx->opcode);
    TCGv t0, t1;
    TCGv_i64 t2;
    gen_set_access_type(ctx, ACCESS_FLOAT);
    t2 = tcg_temp_new_i64(tcg_ctx);
    t0 = tcg_temp_new(tcg_ctx);
    gen_addr_imm_index(ctx, t0, 0);
    get_fpr(tcg_ctx, t2, rd);
    gen_qemu_st64_i64(ctx, t2, t0);
    t1 = tcg_temp_new(tcg_ctx);
    gen_addr_add(ctx, t1, t0, 8);
    get_fpr(tcg_ctx, t2, (rd + 1) % 32);
    gen_qemu_st64_i64(ctx, t2, t1);
    tcg_temp_free(tcg_ctx, t1);
    if (ra != 0) {
        tcg_gen_mov_tl(tcg_ctx, cpu_gpr[ra], t0);
    }
    tcg_temp_free(tcg_ctx, t0);
    tcg_temp_free_i64(tcg_ctx, t2);
}